

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-typed-test.cc
# Opt level: O1

char * __thiscall
testing::internal::TypedTestCasePState::VerifyRegisteredTestNames
          (TypedTestCasePState *this,char *file,int line,char *registered_tests)

{
  byte *pbVar1;
  _Rb_tree_header *p_Var2;
  _Base_ptr __n;
  _Alloc_hider _Var3;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  sVar4;
  int iVar5;
  int iVar6;
  char *pcVar7;
  size_t sVar8;
  _Alloc_hider _Var9;
  const_iterator cVar10;
  _Rb_tree_node_base *p_Var11;
  undefined8 extraout_RAX;
  _Base_ptr p_Var12;
  string *name;
  undefined1 __k [8];
  ulong uVar13;
  char *__s;
  ostream *poVar14;
  char *pcVar15;
  string local_e8;
  char *local_c8;
  internal *local_c0;
  undefined1 auStack_b8 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  name_vec;
  undefined1 local_98 [8];
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tests;
  string local_58;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  Message errors;
  
  *this = (TypedTestCasePState)0x1;
  auStack_b8 = (undefined1  [8])0x0;
  name_vec.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  name_vec.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  __s = registered_tests + -1;
  local_c8 = registered_tests;
  local_c0 = (internal *)file;
  tests._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = line;
  do {
    pbVar1 = (byte *)(__s + 1);
    __s = __s + 1;
    iVar5 = isspace((uint)*pbVar1);
  } while (iVar5 != 0);
  do {
    pcVar7 = strchr(__s,0x2c);
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    if (pcVar7 == (char *)0x0) {
      sVar8 = strlen(__s);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,__s,__s + sVar8);
    }
    else {
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,__s,pcVar7);
    }
    _Var9._M_p = local_58._M_dataplus._M_p;
    if (local_58._M_string_length != 0) {
      pcVar7 = local_58._M_dataplus._M_p + local_58._M_string_length;
      do {
        _Var3._M_p = local_58._M_dataplus._M_p;
        iVar5 = isspace((uint)(byte)pcVar7[-1]);
        _Var9._M_p = _Var3._M_p;
        if (iVar5 == 0) break;
        pcVar15 = pcVar7 + -1;
        uVar13 = (long)pcVar15 - (long)_Var3._M_p;
        std::__cxx11::string::_M_erase((ulong)&local_58,uVar13);
        pcVar7 = local_58._M_dataplus._M_p + uVar13;
        _Var9._M_p = local_58._M_dataplus._M_p;
      } while (pcVar15 != _Var3._M_p);
    }
    p_Var2 = &tests._M_t._M_impl.super__Rb_tree_header;
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    local_98 = (undefined1  [8])_Var9._M_p;
    if (_Var9._M_p == local_58._M_dataplus._M_p) {
      tests._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)local_58.field_2._8_8_;
      local_98 = (undefined1  [8])p_Var2;
    }
    tests._M_t._M_impl.super__Rb_tree_header._M_header._1_7_ =
         local_58.field_2._M_allocated_capacity._1_7_;
    tests._M_t._M_impl.super__Rb_tree_header._M_header._M_color._0_1_ =
         local_58.field_2._M_local_buf[0];
    tests._M_t._M_impl._0_8_ = local_58._M_string_length;
    local_58._M_string_length = 0;
    local_58.field_2._M_local_buf[0] = '\0';
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)auStack_b8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98);
    if (local_98 != (undefined1  [8])p_Var2) {
      operator_delete((void *)local_98,tests._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ + 1)
      ;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,
                      CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                               local_58.field_2._M_local_buf[0]) + 1);
    }
    __s = strchr(__s,0x2c);
    if (__s == (char *)0x0) {
      __s = (char *)0x0;
    }
    else {
      do {
        pbVar1 = (byte *)(__s + 1);
        __s = __s + 1;
        iVar5 = isspace((uint)*pbVar1);
      } while (iVar5 != 0);
    }
  } while (__s != (char *)0x0);
  Message::Message((Message *)&local_38);
  p_Var12 = (_Base_ptr)&tests;
  tests._M_t._M_impl._0_8_ = tests._M_t._M_impl._0_8_ & 0xffffffff00000000;
  tests._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  tests._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  tests._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  tests._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = p_Var12;
  tests._M_t._M_impl.super__Rb_tree_header._M_header._M_left = p_Var12;
  if (auStack_b8 !=
      (undefined1  [8])
      name_vec.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    poVar14 = (ostream *)(local_38.ptr_ + 0x10);
    __k = auStack_b8;
    do {
      cVar10 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_98,(key_type *)__k);
      p_Var12 = (_Base_ptr)&tests;
      if (cVar10._M_node == p_Var12) {
        p_Var11 = *(_Rb_tree_node_base **)(this + 0x20);
        if (p_Var11 != (_Rb_tree_node_base *)(this + 0x10)) {
          __n = (_Base_ptr)((key_type *)__k)->_M_string_length;
          do {
            if ((__n == p_Var11[1]._M_parent) &&
               ((__n == (_Base_ptr)0x0 ||
                (iVar5 = bcmp((((key_type *)__k)->_M_dataplus)._M_p,*(void **)(p_Var11 + 1),
                              (size_t)__n), iVar5 == 0)))) {
              std::
              _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              ::_M_insert_unique<std::__cxx11::string_const&>
                        ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                          *)local_98,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__k);
              goto LAB_00180eb5;
            }
            p_Var11 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var11);
          } while (p_Var11 != (_Rb_tree_node_base *)(this + 0x10));
        }
        std::__ostream_insert<char,std::char_traits<char>>(poVar14,"No test named ",0xe);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar14,(((key_type *)__k)->_M_dataplus)._M_p,((key_type *)__k)->_M_string_length
                  );
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar14," can be found in this test case.\n",0x21);
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>(poVar14,"Test ",5);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar14,(((key_type *)__k)->_M_dataplus)._M_p,((key_type *)__k)->_M_string_length
                  );
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar14," is listed more than once.\n",0x1b);
      }
LAB_00180eb5:
      __k = (undefined1  [8])((long)__k + 0x20);
    } while (__k != (undefined1  [8])
                    name_vec.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  iVar5 = (int)p_Var12;
  p_Var11 = *(_Rb_tree_node_base **)(this + 0x20);
  if (p_Var11 != (_Rb_tree_node_base *)(this + 0x10)) {
    do {
      cVar10 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_98,(key_type *)(p_Var11 + 1));
      p_Var12 = (_Base_ptr)&tests;
      if (cVar10._M_node == p_Var12) {
        poVar14 = (ostream *)(local_38.ptr_ + 0x10);
        std::__ostream_insert<char,std::char_traits<char>>(poVar14,"You forgot to list test ",0x18);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar14,*(char **)(p_Var11 + 1),(long)p_Var11[1]._M_parent);
        std::__ostream_insert<char,std::char_traits<char>>(poVar14,".\n",2);
      }
      iVar5 = (int)p_Var12;
      p_Var11 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var11);
    } while (p_Var11 != (_Rb_tree_node_base *)(this + 0x10));
  }
  sVar4.ptr_ = local_38.ptr_;
  StringStreamToString(&local_58,local_38.ptr_);
  iVar6 = std::__cxx11::string::compare((char *)&local_58);
  if (iVar6 != 0) {
    FormatFileLocation_abi_cxx11_
              (&local_e8,local_c0,
               (char *)(ulong)tests._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_,iVar5);
    VerifyRegisteredTestNames();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,
                      CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                               local_58.field_2._M_local_buf[0]) + 1);
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_98);
    if (local_38.ptr_ != (stringstream *)0x0) {
      (**(code **)(*(long *)local_38.ptr_ + 8))();
      local_38.ptr_ = (stringstream *)0x0;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)auStack_b8);
    _Unwind_Resume(extraout_RAX);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,
                    CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                             local_58.field_2._M_local_buf[0]) + 1);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_98);
  if (sVar4.ptr_ != (stringstream *)0x0) {
    (**(code **)(*(long *)sVar4.ptr_ + 8))(sVar4.ptr_);
    local_38.ptr_ = (stringstream *)0x0;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)auStack_b8);
  return local_c8;
}

Assistant:

const char* TypedTestCasePState::VerifyRegisteredTestNames(
    const char* file, int line, const char* registered_tests) {
  typedef RegisteredTestsMap::const_iterator RegisteredTestIter;
  registered_ = true;

  std::vector<std::string> name_vec = SplitIntoTestNames(registered_tests);

  Message errors;

  std::set<std::string> tests;
  for (std::vector<std::string>::const_iterator name_it = name_vec.begin();
       name_it != name_vec.end(); ++name_it) {
    const std::string& name = *name_it;
    if (tests.count(name) != 0) {
      errors << "Test " << name << " is listed more than once.\n";
      continue;
    }

    bool found = false;
    for (RegisteredTestIter it = registered_tests_.begin();
         it != registered_tests_.end();
         ++it) {
      if (name == it->first) {
        found = true;
        break;
      }
    }

    if (found) {
      tests.insert(name);
    } else {
      errors << "No test named " << name
             << " can be found in this test case.\n";
    }
  }

  for (RegisteredTestIter it = registered_tests_.begin();
       it != registered_tests_.end();
       ++it) {
    if (tests.count(it->first) == 0) {
      errors << "You forgot to list test " << it->first << ".\n";
    }
  }

  const std::string& errors_str = errors.GetString();
  if (errors_str != "") {
    fprintf(stderr, "%s %s", FormatFileLocation(file, line).c_str(),
            errors_str.c_str());
    fflush(stderr);
    posix::Abort();
  }

  return registered_tests;
}